

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileOptions * __thiscall
google::protobuf::DescriptorPool::Tables::AllocateMessage<google::protobuf::FileOptions>
          (Tables *this,FileOptions *param_2)

{
  FileOptions *pFVar1;
  FileOptions *in_RSI;
  FileOptions *result;
  FileOptions **in_stack_ffffffffffffffd8;
  vector<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>,_std::allocator<std::unique_ptr<google::protobuf::Message,_std::default_delete<google::protobuf::Message>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  pFVar1 = (FileOptions *)operator_new(0xa8);
  FileOptions::FileOptions(in_RSI);
  std::
  vector<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>,std::allocator<std::unique_ptr<google::protobuf::Message,std::default_delete<google::protobuf::Message>>>>
  ::emplace_back<google::protobuf::FileOptions*&>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return pFVar1;
}

Assistant:

Type* DescriptorPool::Tables::AllocateMessage(Type* /* dummy */) {
  Type* result = new Type;
  messages_.emplace_back(result);
  return result;
}